

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_fill_random
              (mbedtls_mpi *X,size_t size,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  void *in_RCX;
  _func_int_void_ptr_uchar_ptr_size_t *in_RDX;
  ulong in_RSI;
  size_t in_RDI;
  size_t limbs;
  int ret;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mbedtls_mpi_resize_clear
                    ((mbedtls_mpi *)((in_RSI >> 3) + (ulong)((in_RSI & 7) != 0)),0x891824);
  if (iVar1 == 0) {
    if (in_RSI == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = mbedtls_mpi_core_fill_random
                        ((mbedtls_mpi_uint *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI
                         ,in_RDX,in_RCX);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_fill_random(mbedtls_mpi *X, size_t size,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(size);

    /* Ensure that target MPI has exactly the necessary number of limbs */
    MBEDTLS_MPI_CHK(mbedtls_mpi_resize_clear(X, limbs));
    if (size == 0) {
        return 0;
    }

    ret = mbedtls_mpi_core_fill_random(X->p, X->n, size, f_rng, p_rng);

cleanup:
    return ret;
}